

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JammingTechnique.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::JammingTechnique::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,JammingTechnique *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Kind:        ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Category:    ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Subcategory: ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Specific:    ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString JammingTechnique::GetAsString() const
{
    KStringStream ss;

    ss << "Kind:        " << static_cast<KUINT16>(m_ui8Kind)        << endl
       << "Category:    " << static_cast<KUINT16>(m_ui8Category)    << endl
       << "Subcategory: " << static_cast<KUINT16>(m_ui8Subcategory) << endl
       << "Specific:    " << static_cast<KUINT16>(m_ui8Specific)    << endl;

    return ss.str();
}